

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintStamp.cpp
# Opt level: O2

void __thiscall OpenMD::ConstraintStamp::~ConstraintStamp(ConstraintStamp *this)

{
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ConstraintStamp_002bdb10;
  ParameterBase::~ParameterBase(&(this->PrintConstraintForce).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->ConstrainedDistance).super_ParameterBase);
  DataHolder::~DataHolder(&this->super_DataHolder);
  return;
}

Assistant:

ConstraintStamp::~ConstraintStamp() {}